

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void PROCDumpThreadList(void)

{
  CPalThread *local_10;
  CPalThread *pThread;
  
  PROCProcessLock();
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  local_10 = CorUnix::pGThreadList;
  while( true ) {
    if (local_10 == (CPalThread *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      PROCProcessUnlock();
      return;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) break;
    CorUnix::CPalThread::GetThreadId(local_10);
    CorUnix::CPalThread::GetLwpId(local_10);
    CorUnix::CThreadSynchronizationInfo::GetThreadState(&local_10->synchronizationInfo);
    CorUnix::CThreadSuspensionInfo::GetSuspendedForShutdown(&local_10->suspensionInfo);
    local_10 = CorUnix::CPalThread::GetNext(local_10);
  }
  abort();
}

Assistant:

void PROCDumpThreadList()
{
    CPalThread *pThread;

    PROCProcessLock();

    TRACE ("Threads:{\n");

    pThread = pGThreadList;
    while (NULL != pThread)
    {
        TRACE ("    {pThr=0x%p tid=%#x lwpid=%#x state=%d finsusp=%d}\n",
               pThread, (int)pThread->GetThreadId(), (int)pThread->GetLwpId(),
               (int)pThread->synchronizationInfo.GetThreadState(),
               (int)pThread->suspensionInfo.GetSuspendedForShutdown());

        pThread = pThread->GetNext();
    }
    TRACE ("Threads:}\n");

    PROCProcessUnlock();
}